

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_genparams.hpp
# Opt level: O3

void __thiscall
iutest::detail::iuValuesInParamsGenerator<float>::iuValuesInParamsGenerator<float_const*>
          (iuValuesInParamsGenerator<float> *this,float *begin,float *end)

{
  (this->super_iuIParamGenerator<float>)._vptr_iuIParamGenerator =
       (_func_int **)&PTR__iuValuesInParamsGenerator_001b0658;
  (this->m_values).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  (this->m_values).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  (this->m_values).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  (this->m_it)._M_current = (float *)0x0;
  std::vector<float,std::allocator<float>>::_M_range_insert<float_const*>
            ((vector<float,std::allocator<float>> *)&this->m_values,0,begin,end);
  return;
}

Assistant:

iuValuesInParamsGenerator(Ite begin, Ite end)
    {
        m_values.insert(m_values.end(), begin, end);
    }